

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void * jx9StreamOpenHandle(jx9_vm *pVm,jx9_io_stream *pStream,char *zFile,int iFlags,int use_include
                          ,jx9_value *pResource,int bPushInclude,int *pNew)

{
  SySet *pSet;
  char cVar1;
  int iVar2;
  sxi32 sVar3;
  void *pHandle;
  int local_88;
  int local_84;
  jx9_vm *local_80;
  SyBlob sWorker;
  SyString sFile;
  SyString *pPath;
  
  pHandle = (void *)0x0;
  if (pStream != (jx9_io_stream *)0x0) {
    sFile.zString = zFile;
    sFile.nByte = SyStrlen(zFile);
    if (use_include == 0) {
      iVar2 = (*pStream->xOpen)(zFile,iFlags,pResource,&pHandle);
    }
    else {
      cVar1 = *zFile;
      local_84 = iFlags;
      if (((cVar1 == '/') || ((cVar1 == '.' && 1 < sFile.nByte && (zFile[1] == '/')))) ||
         ((2 < sFile.nByte && cVar1 == '.' && ((zFile[1] == '.' && (zFile[2] == '/')))))) {
        iVar2 = (*pStream->xOpen)(zFile,iFlags,pResource,&pHandle);
      }
      else {
        sWorker.pBlob = (void *)0x0;
        sWorker.nByte = 0;
        sWorker.mByte = 0;
        sWorker.nFlags = 0;
        (pVm->aPaths).nCursor = 0;
        pSet = &pVm->aPaths;
        local_88 = -2;
        local_80 = pVm;
        sWorker.pAllocator = &pVm->sAllocator;
        while (sVar3 = SySetGetNextEntry(pSet,&pPath), pVm = local_80, iVar2 = local_88, sVar3 == 0)
        {
          SyBlobFormat(&sWorker,"%z%c%z",pPath,0x2f,&sFile);
          sVar3 = SyBlobNullAppend(&sWorker);
          if (sVar3 == 0) {
            local_88 = (*pStream->xOpen)((char *)sWorker.pBlob,local_84,pResource,&pHandle);
            pVm = local_80;
            if (local_88 == 0) {
              if (bPushInclude == 0) {
                iVar2 = 0;
              }
              else {
                jx9VmPushFilePath(local_80,(char *)sWorker.pBlob,sWorker.nByte,'\0',pNew);
                iVar2 = 0;
              }
              break;
            }
            sWorker._16_8_ = sWorker._16_8_ & 0xffffffff00000000;
            if ((sWorker.nFlags & 4) != 0) {
              sWorker.pBlob = (void *)0x0;
              sWorker.nByte = 0;
              sWorker.mByte = 0;
              sWorker.nFlags = sWorker.nFlags & 0xfffffffb;
            }
          }
        }
        SyBlobRelease(&sWorker);
      }
      if ((bPushInclude != 0) && (iVar2 == 0)) {
        jx9VmPushFilePath(pVm,sFile.zString,sFile.nByte,'\0',pNew);
        return pHandle;
      }
    }
    if (iVar2 == 0) {
      return pHandle;
    }
  }
  return (void *)0x0;
}

Assistant:

JX9_PRIVATE void * jx9StreamOpenHandle(jx9_vm *pVm, const jx9_io_stream *pStream, const char *zFile, 
	int iFlags, int use_include, jx9_value *pResource, int bPushInclude, int *pNew)
{
	void *pHandle = 0; /* cc warning */
	SyString sFile;
	int rc;
	if( pStream == 0 ){
		/* No such stream device */
		return 0;
	}
	SyStringInitFromBuf(&sFile, zFile, SyStrlen(zFile));
	if( use_include ){
		if(	sFile.zString[0] == '/' ||
#ifdef __WINNT__
			(sFile.nByte > 2 && sFile.zString[1] == ':' && (sFile.zString[2] == '\\' || sFile.zString[2] == '/') ) ||
#endif
			(sFile.nByte > 1 && sFile.zString[0] == '.' && sFile.zString[1] == '/') ||
			(sFile.nByte > 2 && sFile.zString[0] == '.' && sFile.zString[1] == '.' && sFile.zString[2] == '/') ){
				/*  Open the file directly */
				rc = pStream->xOpen(zFile, iFlags, pResource, &pHandle);
		}else{
			SyString *pPath;
			SyBlob sWorker;
#ifdef __WINNT__
			static const int c = '\\';
#else
			static const int c = '/';
#endif
			/* Init the path builder working buffer */
			SyBlobInit(&sWorker, &pVm->sAllocator);
			/* Build a path from the set of include path */
			SySetResetCursor(&pVm->aPaths);
			rc = SXERR_IO;
			while( SXRET_OK == SySetGetNextEntry(&pVm->aPaths, (void **)&pPath) ){
				/* Build full path */
				SyBlobFormat(&sWorker, "%z%c%z", pPath, c, &sFile);
				/* Append null terminator */
				if( SXRET_OK != SyBlobNullAppend(&sWorker) ){
					continue;
				}
				/* Try to open the file */
				rc = pStream->xOpen((const char *)SyBlobData(&sWorker), iFlags, pResource, &pHandle);
				if( rc == JX9_OK ){
					if( bPushInclude ){
						/* Mark as included */
						jx9VmPushFilePath(pVm, (const char *)SyBlobData(&sWorker), SyBlobLength(&sWorker), FALSE, pNew);
					}
					break;
				}
				/* Reset the working buffer */
				SyBlobReset(&sWorker);
				/* Check the next path */
			}
			SyBlobRelease(&sWorker);
		}
		if( rc == JX9_OK ){
			if( bPushInclude ){
				/* Mark as included */
				jx9VmPushFilePath(pVm, sFile.zString, sFile.nByte, FALSE, pNew);
			}
		}
	}else{
		/* Open the URI direcly */
		rc = pStream->xOpen(zFile, iFlags, pResource, &pHandle);
	}
	if( rc != JX9_OK ){
		/* IO error */
		return 0;
	}
	/* Return the file handle */
	return pHandle;
}